

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void err_msg<unsigned_int>(string *msg,uint t,bool expected)

{
  ostream *poVar1;
  byte in_DL;
  string *in_RDI;
  uint in_stack_0000015c;
  string local_30 [35];
  byte local_d;
  
  local_d = in_DL & 1;
  poVar1 = std::operator<<((ostream *)&std::cerr,in_RDI);
  to_hex<unsigned_int>(in_stack_0000015c);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,", expected = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_d & 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void err_msg(const std::string& msg, T t, bool expected)
{
	std::cerr << msg << to_hex(t) << ", expected = " << expected << std::endl;
}